

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O1

void __thiscall
Function_Pool::FunctionTask::ProjectionProfile
          (FunctionTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          bool horizontal,vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  size_t count;
  
  FunctionPoolTask::_setup(&this->super_FunctionPoolTask,image,x,y,width,height);
  count = AreaInfo::_size(&((this->super_FunctionPoolTask)._infoIn1._M_t.
                            super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                            .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>.
                           _M_head_impl)->super_AreaInfo);
  OutputInfo::resize(&this->_dataOut,count);
  (this->_dataIn).horizontalProjection = horizontal;
  this->functionId = _ProjectionProfile;
  FunctionPoolTask::_processTask(&this->super_FunctionPoolTask);
  if (horizontal) {
    height = width;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,(ulong)height);
  OutputInfo::getProjection(&this->_dataOut,projection);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                                std::vector < uint32_t > & projection )
        {
            _setup( image, x, y, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _dataIn.horizontalProjection = horizontal;
            _process( _ProjectionProfile );

            projection.resize( horizontal ? width : height );
            _dataOut.getProjection( projection );
        }